

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

Port * __thiscall
kratos::Generator::port(Generator *this,PortPackedStruct *port,string *port_name,bool check_param)

{
  element_type *new_var;
  element_type *peVar1;
  shared_ptr<kratos::PackedStruct> local_58;
  undefined1 local_44 [12];
  undefined1 local_38 [8];
  shared_ptr<kratos::PortPackedStruct> p;
  bool check_param_local;
  string *port_name_local;
  PortPackedStruct *port_local;
  Generator *this_local;
  
  local_44._4_8_ = this;
  p.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
       = check_param;
  local_44._0_4_ = Port::port_direction(&port->super_Port);
  (*(port->super_Port).super_Var.super_IRNode._vptr_IRNode[0x2e])();
  std::
  make_shared<kratos::PortPackedStruct,kratos::Generator*,kratos::PortDirection,std::__cxx11::string_const&,std::shared_ptr<kratos::PackedStruct>>
            ((Generator **)local_38,(PortDirection *)(local_44 + 4),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_44,
             (shared_ptr<kratos::PackedStruct> *)port_name);
  std::shared_ptr<kratos::PackedStruct>::~shared_ptr(&local_58);
  (*(this->super_IRNode)._vptr_IRNode[7])(this,port_name);
  std::
  map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
  ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::PortPackedStruct>&>
            ((map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
              *)&this->vars_,port_name,(shared_ptr<kratos::PortPackedStruct> *)local_38);
  new_var = std::__shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2> *)
                       local_38);
  Var::copy_meta_data((Var *)port,(Var *)new_var,
                      (bool)(p.
                             super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi._7_1_ & 1));
  peVar1 = std::
           __shared_ptr_access<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_38);
  std::shared_ptr<kratos::PortPackedStruct>::~shared_ptr
            ((shared_ptr<kratos::PortPackedStruct> *)local_38);
  return &peVar1->super_Port;
}

Assistant:

Port &Generator::port(const PortPackedStruct &port, const std::string &port_name,
                      bool check_param) {
    auto p = std::make_shared<PortPackedStruct>(this, port.port_direction(), port_name,
                                                port.packed_struct());
    add_port_name(port_name);
    vars_.emplace(port_name, p);

    port.copy_meta_data(p.get(), check_param);

    return *p;
}